

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

void * epoll_init(event_base *base)

{
  int iVar1;
  int iVar2;
  undefined8 *ptr;
  void *pvVar3;
  char *pcVar4;
  int *piVar5;
  uint32_t local_24;
  int local_20;
  undefined4 local_1c;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 == -1) {
    iVar1 = epoll_create(32000);
    if (iVar1 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 == 0x26) {
        return (void *)0x0;
      }
      event_warn("epoll_create");
      return (void *)0x0;
    }
    evutil_make_socket_closeonexec(iVar1);
  }
  ptr = (undefined8 *)event_mm_calloc_(1,0x18);
  if (ptr == (undefined8 *)0x0) {
LAB_001b2d52:
    close(iVar1);
    return (void *)0x0;
  }
  *(int *)((long)ptr + 0xc) = iVar1;
  pvVar3 = event_mm_calloc_(0x20,0xc);
  *ptr = pvVar3;
  if (pvVar3 == (void *)0x0) {
    event_mm_free_(ptr);
    goto LAB_001b2d52;
  }
  *(undefined4 *)(ptr + 1) = 0x20;
  if (((base->flags & EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST) != 0) ||
     (((base->flags & EVENT_BASE_FLAG_IGNORE_ENV) == 0 &&
      (pcVar4 = evutil_getenv_("EVENT_EPOLL_USE_CHANGELIST"), pcVar4 != (char *)0x0)))) {
    base->evsel = &epollops_changelist;
  }
  if (((base->flags & EVENT_BASE_FLAG_PRECISE_TIMER) != 0) &&
     ((base->monotonic_timer).monotonic_clock == 1)) {
    iVar1 = timerfd_create(1,0x80800);
    *(int *)(ptr + 2) = iVar1;
    if (iVar1 < 0) {
      piVar5 = __errno_location();
      if ((*piVar5 != 0x16) && (*piVar5 != 0x26)) {
        event_warn("timerfd_create");
      }
    }
    else {
      local_1c = 0;
      local_24 = 1;
      local_20 = iVar1;
      iVar2 = epoll_ctl(*(int *)((long)ptr + 0xc),1,iVar1,(epoll_event *)&local_24);
      if (-1 < iVar2) goto LAB_001b2d9f;
      event_warn("epoll_ctl(timerfd)");
      close(iVar1);
    }
  }
  *(undefined4 *)(ptr + 2) = 0xffffffff;
LAB_001b2d9f:
  evsig_init_(base);
  return ptr;
}

Assistant:

static void *
epoll_init(struct event_base *base)
{
	int epfd = -1;
	struct epollop *epollop;

#ifdef EVENT__HAVE_EPOLL_CREATE1
	/* First, try the shiny new epoll_create1 interface, if we have it. */
	epfd = epoll_create1(EPOLL_CLOEXEC);
#endif
	if (epfd == -1) {
		/* Initialize the kernel queue using the old interface.  (The
		size field is ignored   since 2.6.8.) */
		if ((epfd = epoll_create(32000)) == -1) {
			if (errno != ENOSYS)
				event_warn("epoll_create");
			return (NULL);
		}
		evutil_make_socket_closeonexec(epfd);
	}

	if (!(epollop = mm_calloc(1, sizeof(struct epollop)))) {
		close(epfd);
		return (NULL);
	}

	epollop->epfd = epfd;

	/* Initialize fields */
	epollop->events = mm_calloc(INITIAL_NEVENT, sizeof(struct epoll_event));
	if (epollop->events == NULL) {
		mm_free(epollop);
		close(epfd);
		return (NULL);
	}
	epollop->nevents = INITIAL_NEVENT;

	if ((base->flags & EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST) != 0 ||
	    ((base->flags & EVENT_BASE_FLAG_IGNORE_ENV) == 0 &&
		evutil_getenv_("EVENT_EPOLL_USE_CHANGELIST") != NULL)) {

		base->evsel = &epollops_changelist;
	}

#ifdef USING_TIMERFD
	/*
	  The epoll interface ordinarily gives us one-millisecond precision,
	  so on Linux it makes perfect sense to use the CLOCK_MONOTONIC_COARSE
	  timer.  But when the user has set the new PRECISE_TIMER flag for an
	  event_base, we can try to use timerfd to give them finer granularity.
	*/
	if ((base->flags & EVENT_BASE_FLAG_PRECISE_TIMER) &&
	    base->monotonic_timer.monotonic_clock == CLOCK_MONOTONIC) {
		int fd;
		fd = epollop->timerfd = timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK|TFD_CLOEXEC);
		if (epollop->timerfd >= 0) {
			struct epoll_event epev;
			memset(&epev, 0, sizeof(epev));
			epev.data.fd = epollop->timerfd;
			epev.events = EPOLLIN;
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_ADD, fd, &epev) < 0) {
				event_warn("epoll_ctl(timerfd)");
				close(fd);
				epollop->timerfd = -1;
			}
		} else {
			if (errno != EINVAL && errno != ENOSYS) {
				/* These errors probably mean that we were
				 * compiled with timerfd/TFD_* support, but
				 * we're running on a kernel that lacks those.
				 */
				event_warn("timerfd_create");
			}
			epollop->timerfd = -1;
		}
	} else {
		epollop->timerfd = -1;
	}
#endif

	evsig_init_(base);

	return (epollop);
}